

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::SerializeWithCachedSizes
          (MeanVarianceNormalizeLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  MeanVarianceNormalizeLayerParams *this_local;
  
  bVar1 = acrosschannels(this);
  if (bVar1) {
    bVar1 = acrosschannels(this);
    google::protobuf::internal::WireFormatLite::WriteBool(1,bVar1,output);
  }
  bVar1 = normalizevariance(this);
  if (bVar1) {
    bVar1 = normalizevariance(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  fVar2 = epsilon(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = epsilon(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar2,output);
  }
  return;
}

Assistant:

void MeanVarianceNormalizeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MeanVarianceNormalizeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // bool acrossChannels = 1;
  if (this->acrosschannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(1, this->acrosschannels(), output);
  }

  // bool normalizeVariance = 2;
  if (this->normalizevariance() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->normalizevariance(), output);
  }

  // float epsilon = 3;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->epsilon(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MeanVarianceNormalizeLayerParams)
}